

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O2

c8 * __thiscall
irr::scene::COBJMeshFileLoader::readVec3
          (COBJMeshFileLoader *this,c8 *bufPtr,vector3df *vec,c8 *bufEnd)

{
  c8 *pcVar1;
  float fVar2;
  c8 wordBuffer [256];
  c8 acStack_128 [256];
  
  pcVar1 = goAndCopyNextWord(this,acStack_128,bufPtr,0x100,bufEnd);
  fVar2 = core::fast_atof(acStack_128,(char **)0x0);
  vec->X = -fVar2;
  pcVar1 = goAndCopyNextWord(this,acStack_128,pcVar1,0x100,bufEnd);
  fVar2 = core::fast_atof(acStack_128,(char **)0x0);
  vec->Y = fVar2;
  pcVar1 = goAndCopyNextWord(this,acStack_128,pcVar1,0x100,bufEnd);
  fVar2 = core::fast_atof(acStack_128,(char **)0x0);
  vec->Z = fVar2;
  return pcVar1;
}

Assistant:

const c8 *COBJMeshFileLoader::readVec3(const c8 *bufPtr, core::vector3df &vec, const c8 *const bufEnd)
{
	const u32 WORD_BUFFER_LENGTH = 256;
	c8 wordBuffer[WORD_BUFFER_LENGTH];

	bufPtr = goAndCopyNextWord(wordBuffer, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
	vec.X = -core::fast_atof(wordBuffer); // change handedness
	bufPtr = goAndCopyNextWord(wordBuffer, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
	vec.Y = core::fast_atof(wordBuffer);
	bufPtr = goAndCopyNextWord(wordBuffer, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
	vec.Z = core::fast_atof(wordBuffer);
	return bufPtr;
}